

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall icu_63::RBBITableBuilder::bofFixup(RBBITableBuilder *this)

{
  RBBINode *pRVar1;
  RBBINode *pRVar2;
  UVector *this_00;
  int *piVar3;
  int index;
  
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    pRVar1 = (*this->fTree)->fLeftChild;
    pRVar2 = pRVar1->fLeftChild;
    this_00 = pRVar1->fRightChild->fFirstPosSet;
    for (index = 0; index < this_00->count; index = index + 1) {
      piVar3 = (int *)UVector::elementAt(this_00,index);
      if ((*piVar3 == 3) && (piVar3[0x1f] == pRVar2->fVal)) {
        setAdd(this,pRVar2->fFollowPos,*(UVector **)(piVar3 + 0x26));
      }
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::bofFixup() {

    if (U_FAILURE(*fStatus)) {
        return;
    }

    //   The parse tree looks like this ...
    //         fTree root  --->       <cat>
    //                               /     \       .
    //                            <cat>   <#end node>
    //                           /     \  .
    //                     <bofNode>   rest
    //                               of tree
    //
    //    We will be adding things to the followPos set of the <bofNode>
    //
    RBBINode  *bofNode = fTree->fLeftChild->fLeftChild;
    U_ASSERT(bofNode->fType == RBBINode::leafChar);
    U_ASSERT(bofNode->fVal == 2);

    // Get all nodes that can be the start a match of the user-written rules
    //  (excluding the fake bofNode)
    //  We want the nodes that can start a match in the
    //     part labeled "rest of tree"
    // 
    UVector *matchStartNodes = fTree->fLeftChild->fRightChild->fFirstPosSet;

    RBBINode *startNode;
    int       startNodeIx;
    for (startNodeIx = 0; startNodeIx<matchStartNodes->size(); startNodeIx++) {
        startNode = (RBBINode *)matchStartNodes->elementAt(startNodeIx);
        if (startNode->fType != RBBINode::leafChar) {
            continue;
        }

        if (startNode->fVal == bofNode->fVal) {
            //  We found a leaf node corresponding to a {bof} that was
            //    explicitly written into a rule.
            //  Add everything from the followPos set of this node to the
            //    followPos set of the fake bofNode at the start of the tree.
            //  
            setAdd(bofNode->fFollowPos, startNode->fFollowPos);
        }
    }
}